

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall DataFilters::isFiltered(DataFilters *this,DataVector *data)

{
  pointer pNVar1;
  pointer pDVar2;
  bool bVar3;
  pointer pNVar4;
  ulong uVar5;
  ulong uVar6;
  
  pNVar4 = (this->_numericFilters).
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->_numericFilters).
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  if (pNVar1 != pNVar4) {
    pDVar2 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
             super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pDVar2 >> 4;
    do {
      uVar6 = (ulong)pNVar4->index;
      if (pNVar4->index < (uint)uVar5) {
        if (uVar5 <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if ((pDVar2[uVar6].active == true) &&
           ((bool)(-(pDVar2[uVar6].value < (pNVar4->filter)._minValue ||
                    (pNVar4->filter)._maxValue < pDVar2[uVar6].value) & 1U) !=
            (pNVar4->filter)._isAccept)) {
          return true;
        }
      }
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != pNVar1);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
    isFiltered(DataVector const & data) const
    {
        unsigned int size = data.size();
        // Iterate through and check if any filter applies to this data point
        if (this->_numericFilters.size() == 0) return true;
        for (std::vector<NumericFilterCase>::const_iterator it = this->_numericFilters.begin(); it != this->_numericFilters.end(); ++it)
        {
            if (it->index >= size || !data.at(it->index).active) continue; // don't check if out-of-range or data is not active
            if (it->filter.isFiltered(data.at(it->index).value)) return true;
        }
        return false;
    }